

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O2

string * __thiscall
pbrt::RGBIlluminantSpectrum::ToString_abi_cxx11_
          (string *__return_storage_ptr__,RGBIlluminantSpectrum *this)

{
  DenselySampledSpectrum *in_R9;
  
  StringPrintf<pbrt::RGBSigmoidPolynomial_const&,float_const&,pbrt::DenselySampledSpectrum_const&>
            (__return_storage_ptr__,
             (pbrt *)"[ RGBIlluminantSpectrum: rsp: %s scale: %f illuminant: %s ]",
             (char *)&this->rsp,(RGBSigmoidPolynomial *)this,(float *)this->illuminant,in_R9);
  return __return_storage_ptr__;
}

Assistant:

std::string RGBIlluminantSpectrum::ToString() const {
    return StringPrintf("[ RGBIlluminantSpectrum: rsp: %s scale: %f illuminant: %s ]",
                        rsp, scale, *illuminant);
}